

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.test.cpp
# Opt level: O3

void verifyChunkLF9(PartialDistribution *chunk)

{
  bool bVar1;
  long lVar2;
  variant_alternative_t<3UL,_variant<TabulatedSpectrum,_GeneralEvaporationSpectrum,_MaxwellianFissionSpectrum,_EvaporationSpectrum,_WattSpectrum,_MadlandNixSpectrum>_>
  *pvVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  AssertionHandler catchAssertionHandler_28;
  EvaporationSpectrum d;
  Probability p;
  undefined1 local_200 [8];
  undefined8 local_1f8;
  double *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [2];
  bool local_1c5;
  IResultCapture *local_1c0;
  double local_1b8;
  undefined1 local_1b0 [8];
  undefined8 local_1a8;
  ITransientExpression *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [2];
  undefined1 local_178 [48];
  undefined1 local_148 [16];
  IResultCapture *local_138;
  vector<long,_std::allocator<long>_> local_130;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_100;
  ITransientExpression local_e8;
  double *local_d8;
  WithinRelMatcher *local_d0;
  undefined1 local_c8 [48];
  undefined1 local_98 [16];
  IResultCapture *local_88;
  vector<long,_std::allocator<long>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  PartialDistribution *local_38;
  
  local_178._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/5/PartialDistribution/test/PartialDistribution.test.cpp"
  ;
  local_178._8_8_ = (pointer)0x2fd;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x23;
  capturedExpression.m_start = "1.789920e+7, WithinRel( chunk.U() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName,(SourceLineInfo *)local_178,capturedExpression,
             ContinueOnFailure);
  local_1b0 = (undefined1  [8])0x417111ec00000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)local_1b0);
  local_1f8._1_1_ = bVar1;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1f0 = (double *)local_1b0;
  local_1e8[0]._0_8_ = (WithinRelMatcher *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/5/PartialDistribution/test/PartialDistribution.test.cpp"
  ;
  local_178._8_8_ = (pointer)0x2fe;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x35;
  capturedExpression_00.m_start = "1.789920e+7, WithinRel( chunk.energyLimitConstant() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_00,(SourceLineInfo *)local_178,
             capturedExpression_00,ContinueOnFailure);
  local_1b0 = (undefined1  [8])0x417111ec00000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)local_1b0);
  local_1f8._1_1_ = bVar1;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1f0 = (double *)local_1b0;
  local_1e8[0]._0_8_ = (WithinRelMatcher *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_c8._0_8_ =
       *(undefined8 *)
        &(chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  local_c8._8_8_ =
       (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_c8._16_8_ =
       (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_c8._24_8_ =
       (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_c8._32_8_ =
       (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_c8._40_8_ =
       (chunk->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_98,
             &(chunk->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_80,
             &(chunk->probability_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,&(chunk->probability_).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,&(chunk->probability_).super_TabulationRecord.yValues);
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x302;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xb;
  capturedExpression_01.m_start = "9 == p.LF()";
  local_38 = chunk;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_01,(SourceLineInfo *)local_200,
             capturedExpression_01,ContinueOnFailure);
  local_1f8._1_1_ = local_c8._16_4_ == 9;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204358;
  local_1f8._4_4_ = 9;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  local_1e8[0]._8_4_ = local_c8._16_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x303;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0xc;
  capturedExpression_02.m_start = "9 == p.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_02,(SourceLineInfo *)local_200,
             capturedExpression_02,ContinueOnFailure);
  local_1f8._1_1_ = local_c8._16_4_ == 9;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204358;
  local_1f8._4_4_ = 9;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  local_1e8[0]._8_4_ = local_c8._16_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x305;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xb;
  capturedExpression_03.m_start = "2 == p.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_03,(SourceLineInfo *)local_200,
             capturedExpression_03,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x306;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x15;
  capturedExpression_04.m_start = "2 == p.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_04,(SourceLineInfo *)local_200,
             capturedExpression_04,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x307;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xb;
  capturedExpression_05.m_start = "1 == p.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_05,(SourceLineInfo *)local_200,
             capturedExpression_05,ContinueOnFailure);
  lVar2 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_1e8[0]._8_8_ = lVar2 >> 3;
  local_1f8._1_1_ = lVar2 == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x308;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x23;
  capturedExpression_06.m_start = "1 == p.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_06,(SourceLineInfo *)local_200,
             capturedExpression_06,ContinueOnFailure);
  lVar2 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_1e8[0]._8_8_ = lVar2 >> 3;
  local_1f8._1_1_ = lVar2 == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x309;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x13;
  capturedExpression_07.m_start = "1 == p.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_07,(SourceLineInfo *)local_200,
             capturedExpression_07,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30a;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x13;
  capturedExpression_08.m_start = "1 == p.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_08,(SourceLineInfo *)local_200,
             capturedExpression_08,ContinueOnFailure);
  lVar2 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_1e8[0]._8_8_ = lVar2 >> 3;
  local_1f8._1_1_ = lVar2 == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30b;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "2 == p.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_09,(SourceLineInfo *)local_200,
             capturedExpression_09,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 2;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30c;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0xf;
  capturedExpression_10.m_start = "2 == p.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_10,(SourceLineInfo *)local_200,
             capturedExpression_10,ContinueOnFailure);
  local_1e8[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 2;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30d;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "1 == p.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_11,(SourceLineInfo *)local_200,
             capturedExpression_11,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30e;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "1 == p.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_12,(SourceLineInfo *)local_200,
             capturedExpression_12,ContinueOnFailure);
  lVar2 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_1e8[0]._8_8_ = lVar2 >> 3;
  local_1f8._1_1_ = lVar2 == 8;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 1;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x30f;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x18;
  capturedExpression_13.m_start = "2 == p.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_13,(SourceLineInfo *)local_200,
             capturedExpression_13,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 2;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x310;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x16;
  capturedExpression_14.m_start = "2 == p.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_14,(SourceLineInfo *)local_200,
             capturedExpression_14,ContinueOnFailure);
  local_1e8[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 2;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x311;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x11;
  capturedExpression_15.m_start = "2 == p.E().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_15,(SourceLineInfo *)local_200,
             capturedExpression_15,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x312;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x18;
  capturedExpression_16.m_start = "2 == p.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_16,(SourceLineInfo *)local_200,
             capturedExpression_16,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x313;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x11;
  capturedExpression_17.m_start = "2 == p.P().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_17,(SourceLineInfo *)local_200,
             capturedExpression_17,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x314;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x1d;
  capturedExpression_18.m_start = "2 == p.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_18,(SourceLineInfo *)local_200,
             capturedExpression_18,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1f8._1_1_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1f8._4_4_ = 2;
  local_1f0 = (double *)0x1c0534;
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x315;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x22;
  capturedExpression_19.m_start = "1.789920e+7, WithinRel( p.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_19,(SourceLineInfo *)local_200,
             capturedExpression_19,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x417111ec00000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x316;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x1b;
  capturedExpression_20.m_start = "2e+7, WithinRel( p.E()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_20,(SourceLineInfo *)local_200,
             capturedExpression_20,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x317;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x29;
  capturedExpression_21.m_start = "1.789920e+7, WithinRel( p.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_21,(SourceLineInfo *)local_200,
             capturedExpression_21,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x417111ec00000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x318;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x22;
  capturedExpression_22.m_start = "2e+7, WithinRel( p.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_22,(SourceLineInfo *)local_200,
             capturedExpression_22,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x319;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x1a;
  capturedExpression_23.m_start = "1.0, WithinRel( p.P()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_23,(SourceLineInfo *)local_200,
             capturedExpression_23,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x31a;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x1a;
  capturedExpression_24.m_start = "1.0, WithinRel( p.P()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_24,(SourceLineInfo *)local_200,
             capturedExpression_24,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x31b;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x26;
  capturedExpression_25.m_start = "1.0, WithinRel( p.probabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_25,(SourceLineInfo *)local_200,
             capturedExpression_25,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1bc50c;
  local_1f8 = (pointer)0x31c;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x26;
  capturedExpression_26.m_start = "1.0, WithinRel( p.probabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_26,(SourceLineInfo *)local_200,
             capturedExpression_26,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_200,(double *)&local_e8);
  local_1a8._1_1_ = bVar1;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204318;
  local_1a0 = &local_e8;
  local_198[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_148[0xb] == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  pvVar3 = std::
           get<3ul,njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                     (&local_38->distribution_);
  local_178._0_8_ =
       *(undefined8 *)
        &(pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.
         metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  local_178._8_8_ =
       (pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.metadata.
       fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_178._16_8_ =
       (pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.metadata.
       fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_178._24_8_ =
       (pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.metadata.
       fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_178._32_8_ =
       (pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.metadata.
       fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_178._40_8_ =
       (pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.metadata.
       fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_148,
             &(pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.
              boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_130,
             &(pvVar3->super_EffectiveTemperature).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_118,&(pvVar3->super_EffectiveTemperature).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_100,&(pvVar3->super_EffectiveTemperature).super_TabulationRecord.yValues);
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x31f;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0xb;
  capturedExpression_27.m_start = "9 == d.LF()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_27,(SourceLineInfo *)local_1b0,
             capturedExpression_27,ContinueOnFailure);
  local_1a8._0_2_ = 0x101;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204358;
  local_1a8._4_4_ = 9;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  local_198[0]._8_4_ = 9;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x320;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0xc;
  capturedExpression_28.m_start = "9 == d.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_28,(SourceLineInfo *)local_1b0,
             capturedExpression_28,ContinueOnFailure);
  local_1a8._0_2_ = 0x101;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204358;
  local_1a8._4_4_ = 9;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  local_198[0]._8_4_ = 9;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x321;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0xb;
  capturedExpression_29.m_start = "4 == d.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_29,(SourceLineInfo *)local_1b0,
             capturedExpression_29,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x20;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x322;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x15;
  capturedExpression_30.m_start = "4 == d.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_30,(SourceLineInfo *)local_1b0,
             capturedExpression_30,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x20;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x323;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0xb;
  capturedExpression_31.m_start = "1 == d.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_31,(SourceLineInfo *)local_1b0,
             capturedExpression_31,ContinueOnFailure);
  lVar2 = CONCAT44(local_148._12_4_,local_148._8_4_) - local_148._0_8_;
  local_198[0]._8_8_ = lVar2 >> 3;
  local_1a8._1_1_ = lVar2 == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x324;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x23;
  capturedExpression_32.m_start = "1 == d.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_32,(SourceLineInfo *)local_1b0,
             capturedExpression_32,ContinueOnFailure);
  lVar2 = CONCAT44(local_148._12_4_,local_148._8_4_) - local_148._0_8_;
  local_198[0]._8_8_ = lVar2 >> 3;
  local_1a8._1_1_ = lVar2 == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x325;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x13;
  capturedExpression_33.m_start = "1 == d.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_33,(SourceLineInfo *)local_1b0,
             capturedExpression_33,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x326;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x13;
  capturedExpression_34.m_start = "1 == d.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_34,(SourceLineInfo *)local_1b0,
             capturedExpression_34,ContinueOnFailure);
  lVar2 = CONCAT44(local_148._12_4_,local_148._8_4_) - local_148._0_8_;
  local_198[0]._8_8_ = lVar2 >> 3;
  local_1a8._1_1_ = lVar2 == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x327;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0xf;
  capturedExpression_35.m_start = "2 == d.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_35,(SourceLineInfo *)local_1b0,
             capturedExpression_35,ContinueOnFailure);
  local_198[0]._8_8_ =
       *local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_1a8._1_1_ = local_198[0]._8_8_ == 2;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 2;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x328;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0xf;
  capturedExpression_36.m_start = "4 == d.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_36,(SourceLineInfo *)local_1b0,
             capturedExpression_36,ContinueOnFailure);
  local_198[0]._8_8_ = *(undefined8 *)local_148._0_8_;
  local_1a8._1_1_ = local_198[0]._8_8_ == 4;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x329;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x1c;
  capturedExpression_37.m_start = "1 == d.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_37,(SourceLineInfo *)local_1b0,
             capturedExpression_37,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32a;
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  capturedExpression_38.m_size = 0x1a;
  capturedExpression_38.m_start = "1 == d.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_38,(SourceLineInfo *)local_1b0,
             capturedExpression_38,ContinueOnFailure);
  lVar2 = CONCAT44(local_148._12_4_,local_148._8_4_) - local_148._0_8_;
  local_198[0]._8_8_ = lVar2 >> 3;
  local_1a8._1_1_ = lVar2 == 8;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 1;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32b;
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  capturedExpression_39.m_size = 0x18;
  capturedExpression_39.m_start = "2 == d.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_39,(SourceLineInfo *)local_1b0,
             capturedExpression_39,ContinueOnFailure);
  local_198[0]._8_8_ =
       *local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_1a8._1_1_ = local_198[0]._8_8_ == 2;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 2;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32c;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x16;
  capturedExpression_40.m_start = "4 == d.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_40,(SourceLineInfo *)local_1b0,
             capturedExpression_40,ContinueOnFailure);
  local_198[0]._8_8_ = *(undefined8 *)local_148._0_8_;
  local_1a8._1_1_ = local_198[0]._8_8_ == 4;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32d;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0x11;
  capturedExpression_41.m_start = "4 == d.E().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_41,(SourceLineInfo *)local_1b0,
             capturedExpression_41,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x20;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32e;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x18;
  capturedExpression_42.m_start = "4 == d.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_42,(SourceLineInfo *)local_1b0,
             capturedExpression_42,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x20;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x32f;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0x16;
  capturedExpression_43.m_start = "4 == d.thetas().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_43,(SourceLineInfo *)local_1b0,
             capturedExpression_43,ContinueOnFailure);
  local_198[0]._8_8_ =
       (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1a8._1_1_ =
       (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x20;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_002043d8;
  local_1a8._4_4_ = 4;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x330;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x22;
  capturedExpression_44.m_start = "1.789920e+7, WithinRel( d.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_44,(SourceLineInfo *)local_1b0,
             capturedExpression_44,ContinueOnFailure);
  local_1b8 = 17899200.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x331;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x1d;
  capturedExpression_45.m_start = "1.8e+7, WithinRel( d.E()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_45,(SourceLineInfo *)local_1b0,
             capturedExpression_45,ContinueOnFailure);
  local_1b8 = 18000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x332;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x1d;
  capturedExpression_46.m_start = "1.9e+7, WithinRel( d.E()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_46,(SourceLineInfo *)local_1b0,
             capturedExpression_46,ContinueOnFailure);
  local_1b8 = 19000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x333;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x1b;
  capturedExpression_47.m_start = "2e+7, WithinRel( d.E()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_47,(SourceLineInfo *)local_1b0,
             capturedExpression_47,ContinueOnFailure);
  local_1b8 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x334;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x29;
  capturedExpression_48.m_start = "1.789920e+7, WithinRel( d.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_48,(SourceLineInfo *)local_1b0,
             capturedExpression_48,ContinueOnFailure);
  local_1b8 = 17899200.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x335;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x24;
  capturedExpression_49.m_start = "1.8e+7, WithinRel( d.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_49,(SourceLineInfo *)local_1b0,
             capturedExpression_49,ContinueOnFailure);
  local_1b8 = 18000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x336;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x24;
  capturedExpression_50.m_start = "1.9e+7, WithinRel( d.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_50,(SourceLineInfo *)local_1b0,
             capturedExpression_50,ContinueOnFailure);
  local_1b8 = 19000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x337;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x22;
  capturedExpression_51.m_start = "2e+7, WithinRel( d.energies()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_51,(SourceLineInfo *)local_1b0,
             capturedExpression_51,ContinueOnFailure);
  local_1b8 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x338;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x25;
  capturedExpression_52.m_start = "1.0099e+5, WithinRel( d.thetas()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_52,(SourceLineInfo *)local_1b0,
             capturedExpression_52,ContinueOnFailure);
  local_1b8 = 100990.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             *local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x339;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x25;
  capturedExpression_53.m_start = "1.0099e+5, WithinRel( d.thetas()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_53,(SourceLineInfo *)local_1b0,
             capturedExpression_53,ContinueOnFailure);
  local_1b8 = 100990.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x33a;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x25;
  capturedExpression_54.m_start = "1.1292e+5, WithinRel( d.thetas()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_54,(SourceLineInfo *)local_1b0,
             capturedExpression_54,ContinueOnFailure);
  local_1b8 = 112920.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x33b;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x25;
  capturedExpression_55.m_start = "1.6143e+5, WithinRel( d.thetas()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_55,(SourceLineInfo *)local_1b0,
             capturedExpression_55,ContinueOnFailure);
  local_1b8 = 161430.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b0,
             local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b0,&local_1b8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00204318;
  local_d8 = &local_1b8;
  local_d0 = (WithinRelMatcher *)local_1b0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_200,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b0 = (undefined1  [8])0x1bc50c;
  local_1a8 = (pointer)0x33d;
  macroName_56.m_size = 5;
  macroName_56.m_start = "CHECK";
  capturedExpression_56.m_size = 0xf;
  capturedExpression_56.m_start = "7 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_56,(SourceLineInfo *)local_1b0,
             capturedExpression_56,ContinueOnFailure);
  local_198[0]._8_8_ = njoy::ENDFtk::section::Type<5>::PartialDistribution::NC(local_38);
  local_1a8._1_1_ = local_198[0]._8_8_ == 7;
  local_1a8._0_1_ = true;
  local_1b0 = (undefined1  [8])&PTR_streamReconstructedExpression_00204398;
  local_1a8._4_4_ = 7;
  local_1a0 = (ITransientExpression *)0x1c0534;
  local_198[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_98._0_8_ != (long *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  return;
}

Assistant:

void verifyChunkLF9( const PartialDistribution& chunk ) {

  CHECK_THAT( 1.789920e+7, WithinRel( chunk.U() ) );
  CHECK_THAT( 1.789920e+7, WithinRel( chunk.energyLimitConstant() ) );

  auto p = chunk.probability();

  CHECK( 9 == p.LF() );
  CHECK( 9 == p.LAW() );

  CHECK( 2 == p.NP() );
  CHECK( 2 == p.numberPoints() );
  CHECK( 1 == p.NR() );
  CHECK( 1 == p.numberInterpolationRegions() );
  CHECK( 1 == p.INT().size() );
  CHECK( 1 == p.NBT().size() );
  CHECK( 2 == p.INT()[0] );
  CHECK( 2 == p.NBT()[0] );
  CHECK( 1 == p.interpolants().size() );
  CHECK( 1 == p.boundaries().size() );
  CHECK( 2 == p.interpolants()[0] );
  CHECK( 2 == p.boundaries()[0] );
  CHECK( 2 == p.E().size() );
  CHECK( 2 == p.energies().size() );
  CHECK( 2 == p.P().size() );
  CHECK( 2 == p.probabilities().size() );
  CHECK_THAT( 1.789920e+7, WithinRel( p.E()[0] ) );
  CHECK_THAT( 2e+7, WithinRel( p.E()[1] ) );
  CHECK_THAT( 1.789920e+7, WithinRel( p.energies()[0] ) );
  CHECK_THAT( 2e+7, WithinRel( p.energies()[1] ) );
  CHECK_THAT( 1.0, WithinRel( p.P()[0] ) );
  CHECK_THAT( 1.0, WithinRel( p.P()[1] ) );
  CHECK_THAT( 1.0, WithinRel( p.probabilities()[0] ) );
  CHECK_THAT( 1.0, WithinRel( p.probabilities()[1] ) );

  auto d = std::get< EvaporationSpectrum >( chunk.distribution() );
  CHECK( 9 == d.LF() );
  CHECK( 9 == d.LAW() );
  CHECK( 4 == d.NP() );
  CHECK( 4 == d.numberPoints() );
  CHECK( 1 == d.NR() );
  CHECK( 1 == d.numberInterpolationRegions() );
  CHECK( 1 == d.INT().size() );
  CHECK( 1 == d.NBT().size() );
  CHECK( 2 == d.INT()[0] );
  CHECK( 4 == d.NBT()[0] );
  CHECK( 1 == d.interpolants().size() );
  CHECK( 1 == d.boundaries().size() );
  CHECK( 2 == d.interpolants()[0] );
  CHECK( 4 == d.boundaries()[0] );
  CHECK( 4 == d.E().size() );
  CHECK( 4 == d.energies().size() );
  CHECK( 4 == d.thetas().size() );
  CHECK_THAT( 1.789920e+7, WithinRel( d.E()[0] ) );
  CHECK_THAT( 1.8e+7, WithinRel( d.E()[1] ) );
  CHECK_THAT( 1.9e+7, WithinRel( d.E()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( d.E()[3] ) );
  CHECK_THAT( 1.789920e+7, WithinRel( d.energies()[0] ) );
  CHECK_THAT( 1.8e+7, WithinRel( d.energies()[1] ) );
  CHECK_THAT( 1.9e+7, WithinRel( d.energies()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( d.energies()[3] ) );
  CHECK_THAT( 1.0099e+5, WithinRel( d.thetas()[0] ) );
  CHECK_THAT( 1.0099e+5, WithinRel( d.thetas()[1] ) );
  CHECK_THAT( 1.1292e+5, WithinRel( d.thetas()[2] ) );
  CHECK_THAT( 1.6143e+5, WithinRel( d.thetas()[3] ) );

  CHECK( 7 == chunk.NC() );
}